

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>::TCompactProtocolT
          (TCompactProtocolT<duckdb::ThriftFileTransport> *this,
          shared_ptr<duckdb::ThriftFileTransport> *trans)

{
  shared_ptr<duckdb_apache::thrift::transport::TTransport> sStack_28;
  
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::ThriftFileTransport,void>
            ((__shared_ptr<duckdb_apache::thrift::transport::TTransport,(__gnu_cxx::_Lock_policy)2>
              *)&sStack_28,
             &trans->super___shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2>);
  TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ::TVirtualProtocol(&this->
                      super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                     ,&sStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  (this->
  super_TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::ThriftFileTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
  ).super_TProtocolDefaults.super_TProtocol._vptr_TProtocol =
       (_func_int **)&PTR__TCompactProtocolT_004db9e0;
  this->trans_ = (trans->super___shared_ptr<duckdb::ThriftFileTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
  std::stack<short,std::deque<short,std::allocator<short>>>::
  stack<std::deque<short,std::allocator<short>>,void>(&this->lastField_);
  this->lastFieldId_ = 0;
  (this->booleanField_).name = (char *)0x0;
  (this->boolValue_).hasBoolValue = false;
  *(undefined8 *)&this->string_limit_ = 0;
  *(undefined8 *)((long)&this->string_buf_ + 4) = 0;
  this->container_limit_ = 0;
  return;
}

Assistant:

TCompactProtocolT(std::shared_ptr<Transport_> trans)
    : TVirtualProtocol<TCompactProtocolT<Transport_> >(trans),
      trans_(trans.get()),
      lastFieldId_(0),
      string_limit_(0),
      string_buf_(nullptr),
      string_buf_size_(0),
      container_limit_(0) {
    booleanField_.name = nullptr;
    boolValue_.hasBoolValue = false;
  }